

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePolicyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_472667::HandleGetWarningMode
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  size_type sVar3;
  char *id_00;
  cmMakefile *this;
  PolicyID id_01;
  string local_120;
  string_view local_100;
  cmAlphaNum local_f0;
  cmAlphaNum local_c0;
  string local_90;
  PolicyID local_6c;
  const_reference pvStack_68;
  PolicyID pid;
  string *var;
  string *id;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  pcVar1 = local_20;
  if (sVar3 == 3) {
    var = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local,1);
    pvStack_68 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,2);
    id_00 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmPolicies::GetPolicyID(id_00,&local_6c);
    pcVar1 = local_20;
    if (bVar2) {
      this = cmExecutionStatus::GetMakefile(local_20);
      name = pvStack_68;
      cmPolicies::GetPolicyWarning_abi_cxx11_(&local_120,(cmPolicies *)(ulong)local_6c,id_01);
      local_100 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_120);
      cmMakefile::AddDefinition(this,name,local_100);
      std::__cxx11::string::~string((string *)&local_120);
      args_local._7_1_ = true;
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_c0,"GET_WARNING given policy \"");
      cmAlphaNum::cmAlphaNum(&local_f0,var);
      cmStrCat<char[47]>(&local_90,&local_c0,&local_f0,
                         (char (*) [47])"\" which is not known to this version of CMake.");
      cmExecutionStatus::SetError(pcVar1,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      args_local._7_1_ = false;
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"GET_WARNING must be given exactly 2 additional arguments.",
               &local_41);
    cmExecutionStatus::SetError(pcVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = false;
  }
  return args_local._7_1_;
}

Assistant:

bool HandleGetWarningMode(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
  if (args.size() != 3) {
    status.SetError(
      "GET_WARNING must be given exactly 2 additional arguments.");
    return false;
  }

  // Get arguments.
  std::string const& id = args[1];
  std::string const& var = args[2];

  // Lookup the policy number.
  cmPolicies::PolicyID pid;
  if (!cmPolicies::GetPolicyID(id.c_str(), pid)) {
    status.SetError(
      cmStrCat("GET_WARNING given policy \"", id,
               "\" which is not known to this version of CMake."));
    return false;
  }

  // Lookup the policy warning.
  status.GetMakefile().AddDefinition(var, cmPolicies::GetPolicyWarning(pid));

  return true;
}